

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimeCoordinator.cpp
# Opt level: O2

void __thiscall
helics::TimeCoordinator::updateMessageTime
          (TimeCoordinator *this,Time messageUpdateTime,bool allowRequestSend)

{
  long lVar1;
  bool bVar2;
  Time TVar3;
  
  if ((this->super_BaseTimeCoordinator).executionMode == false) {
    if (messageUpdateTime.internalTimeCode < 0) {
      this->hasInitUpdates = true;
    }
  }
  else {
    TVar3.internalTimeCode = (this->time_granted).internalTimeCode;
    if (messageUpdateTime.internalTimeCode <= TVar3.internalTimeCode) {
      this->hasIterationData = true;
    }
    lVar1 = (this->time_message).internalTimeCode;
    if (messageUpdateTime.internalTimeCode < lVar1) {
      if (this->iterating == NO_ITERATIONS) {
        TVar3 = getNextPossibleTime(this);
      }
      if (messageUpdateTime.internalTimeCode < TVar3.internalTimeCode) {
        messageUpdateTime.internalTimeCode = TVar3.internalTimeCode;
      }
      (this->time_message).internalTimeCode = messageUpdateTime.internalTimeCode;
      if ((messageUpdateTime.internalTimeCode < lVar1) &&
         ((this->super_BaseTimeCoordinator).disconnected == false)) {
        bVar2 = updateNextExecutionTime(this);
        if (bVar2 && allowRequestSend) {
          sendTimeRequest(this,(GlobalFederateId)0x8831d580);
          return;
        }
      }
    }
  }
  return;
}

Assistant:

void TimeCoordinator::updateMessageTime(Time messageUpdateTime, bool allowRequestSend)
{
    if (!executionMode)  // updates before exec mode
    {
        if (messageUpdateTime < timeZero) {
            hasInitUpdates = true;
        }
        return;
    }
    if (messageUpdateTime <= time_granted) {
        hasIterationData = true;
    }
    if (messageUpdateTime < time_message) {
        auto ptime = time_message;
        if (iterating != IterationRequest::NO_ITERATIONS) {
            time_message = (messageUpdateTime <= time_granted) ? time_granted : messageUpdateTime;
        } else {
            auto nextPossibleTime = getNextPossibleTime();
            if (messageUpdateTime <= nextPossibleTime) {
                time_message = nextPossibleTime;
            } else {
                time_message = messageUpdateTime;
            }
        }
        if (time_message < ptime && !disconnected) {
            if (updateNextExecutionTime()) {
                if (allowRequestSend) {
                    sendTimeRequest(GlobalFederateId{});
                }
            }
        }
    }
}